

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OCTET_STRING.c
# Opt level: O2

asn_enc_rval_t *
OCTET_STRING_encode_xer
          (asn_enc_rval_t *__return_storage_ptr__,asn_TYPE_descriptor_t *td,void *sptr,int ilevel,
          xer_encoder_flags_e flags,asn_app_consume_bytes_f *cb,void *app_key)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  ulong uVar8;
  char *pcVar9;
  size_t sVar10;
  char scratch [52];
  
  if (sptr == (void *)0x0) {
LAB_0014719d:
    __return_storage_ptr__->encoded = -1;
    __return_storage_ptr__->failed_type = td;
    __return_storage_ptr__->structure_ptr = sptr;
    return __return_storage_ptr__;
  }
  pbVar7 = *sptr;
  lVar5 = (long)*(int *)((long)sptr + 8);
  if (pbVar7 == (byte *)0x0) {
    if (*(int *)((long)sptr + 8) != 0) goto LAB_0014719d;
    lVar5 = 0;
  }
  pbVar6 = pbVar7 + lVar5;
  if ((flags & XER_F_CANONICAL) == 0) {
    uVar8 = 0;
    iVar3 = 0;
    if (0 < ilevel) {
      iVar3 = ilevel;
    }
    pcVar9 = scratch;
    pcVar4 = (char *)0x0;
    for (; pbVar7 < pbVar6; pbVar7 = pbVar7 + 1) {
      if (((uVar8 & 0xf) == 0) && ((uVar8 != 0 || (0x10 < *(int *)((long)sptr + 8))))) {
        sVar10 = (long)pcVar9 - (long)scratch;
        iVar1 = (*cb)(scratch,sVar10,app_key);
        if (iVar1 < 0) goto LAB_0014727a;
        iVar2 = (*cb)("\n",1,app_key);
        iVar1 = iVar3 + 1;
        while( true ) {
          if (iVar2 < 0) goto LAB_0014727a;
          iVar1 = iVar1 + -1;
          if (iVar1 == 0) break;
          iVar2 = (*cb)("    ",4,app_key);
        }
        pcVar4 = pcVar4 + sVar10 + (iVar3 * 4 + 1);
        pcVar9 = scratch;
      }
      *pcVar9 = "0123456789ABCDEF"[*pbVar7 >> 4];
      pcVar9[1] = "0123456789ABCDEF"[*pbVar7 & 0xf];
      pcVar9[2] = ' ';
      pcVar9 = pcVar9 + 3;
      uVar8 = uVar8 + 1;
    }
    if (pcVar9 != scratch) {
      iVar3 = (*cb)(scratch,(size_t)(pcVar9 + ~(ulong)scratch),app_key);
      if (-1 < iVar3) {
        pcVar4 = pcVar4 + (long)(pcVar9 + ~(ulong)scratch);
        if (*(int *)((long)sptr + 8) < 0x11) goto LAB_001471d2;
        iVar3 = (*cb)("\n",1,app_key);
        if (-1 < iVar3) {
          iVar3 = 1;
          if (1 < ilevel) {
            iVar3 = ilevel;
          }
          iVar1 = iVar3 + -1;
          do {
            iVar3 = iVar3 + -1;
            if (iVar3 == 0) {
              pcVar4 = pcVar4 + (iVar1 * 4 + 1);
              goto LAB_001471d2;
            }
            iVar2 = (*cb)("    ",4,app_key);
          } while (-1 < iVar2);
        }
      }
LAB_0014727a:
      __return_storage_ptr__->encoded = -1;
      __return_storage_ptr__->failed_type = td;
      __return_storage_ptr__->structure_ptr = sptr;
      return __return_storage_ptr__;
    }
  }
  else {
    sVar10 = 0;
    lVar5 = 0;
    for (; pbVar7 < pbVar6; pbVar7 = pbVar7 + 1) {
      if (0x31 < (long)sVar10) {
        iVar3 = (*cb)(scratch,sVar10,app_key);
        if (iVar3 < 0) goto LAB_0014727a;
        lVar5 = lVar5 + sVar10;
        sVar10 = 0;
      }
      scratch[sVar10] = "0123456789ABCDEF"[*pbVar7 >> 4];
      scratch[sVar10 + 1] = "0123456789ABCDEF"[*pbVar7 & 0xf];
      sVar10 = sVar10 + 2;
    }
    iVar3 = (*cb)(scratch,sVar10,app_key);
    if (iVar3 < 0) goto LAB_0014727a;
    pcVar4 = (char *)(lVar5 + sVar10);
  }
LAB_001471d2:
  __return_storage_ptr__->encoded = (ssize_t)pcVar4;
  __return_storage_ptr__->failed_type = (asn_TYPE_descriptor_s *)0x0;
  __return_storage_ptr__->structure_ptr = (void *)0x0;
  return __return_storage_ptr__;
}

Assistant:

asn_enc_rval_t
OCTET_STRING_encode_xer(asn_TYPE_descriptor_t *td, void *sptr,
	int ilevel, enum xer_encoder_flags_e flags,
		asn_app_consume_bytes_f *cb, void *app_key) {
	const char * const h2c = "0123456789ABCDEF";
	const OCTET_STRING_t *st = (const OCTET_STRING_t *)sptr;
	asn_enc_rval_t er;
	char scratch[16 * 3 + 4];
	char *p = scratch;
	uint8_t *buf;
	uint8_t *end;
	size_t i;

	if(!st || (!st->buf && st->size))
		ASN__ENCODE_FAILED;

	er.encoded = 0;

	/*
	 * Dump the contents of the buffer in hexadecimal.
	 */
	buf = st->buf;
	end = buf + st->size;
	if(flags & XER_F_CANONICAL) {
		char *scend = scratch + (sizeof(scratch) - 2);
		for(; buf < end; buf++) {
			if(p >= scend) {
				ASN__CALLBACK(scratch, p - scratch);
				er.encoded += p - scratch;
				p = scratch;
			}
			*p++ = h2c[(*buf >> 4) & 0x0F];
			*p++ = h2c[*buf & 0x0F];
		}

		ASN__CALLBACK(scratch, p-scratch);	/* Dump the rest */
		er.encoded += p - scratch;
	} else {
		for(i = 0; buf < end; buf++, i++) {
			if(!(i % 16) && (i || st->size > 16)) {
				ASN__CALLBACK(scratch, p-scratch);
				er.encoded += (p-scratch);
				p = scratch;
				ASN__TEXT_INDENT(1, ilevel);
			}
			*p++ = h2c[(*buf >> 4) & 0x0F];
			*p++ = h2c[*buf & 0x0F];
			*p++ = 0x20;
		}
		if(p - scratch) {
			p--;	/* Remove the tail space */
			ASN__CALLBACK(scratch, p-scratch); /* Dump the rest */
			er.encoded += p - scratch;
			if(st->size > 16)
				ASN__TEXT_INDENT(1, ilevel-1);
		}
	}

	ASN__ENCODED_OK(er);
cb_failed:
	ASN__ENCODE_FAILED;
}